

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string file;
  int local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_b8 = local_a8;
  local_b0 = 0;
  local_a8[0] = 0;
  local_fc = number;
  if (number == 0) {
    std::operator+(&local_f8,&base_name->pathname_,".");
    std::operator+(&local_d8,&local_f8,extension);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    this = &local_f8;
  }
  else {
    std::operator+(&local_58,&base_name->pathname_,"_");
    StreamableToString<int>(&local_78,&local_fc);
    std::operator+(&local_38,&local_58,&local_78);
    std::operator+(&local_f8,&local_38,".");
    std::operator+(&local_d8,&local_f8,extension);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    this = &local_58;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::string((string *)&local_98,(string *)&local_b8);
  FilePath((FilePath *)&local_d8,&local_98);
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name, int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file =
        base_name.string() + "_" + StreamableToString(number) + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}